

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cc
# Opt level: O3

bool __thiscall util::fs::File::operator<(File *this,File *rhs)

{
  int iVar1;
  byte extraout_var;
  
  if (this->is_dir == true) {
    if (rhs->is_dir == false) {
      return true;
    }
  }
  else if (rhs->is_dir != false) {
    return false;
  }
  iVar1 = std::__cxx11::string::compare((string *)this);
  if (-1 < iVar1) {
    iVar1 = std::__cxx11::string::compare((string *)rhs);
    if (iVar1 < 0) {
      return false;
    }
    std::__cxx11::string::compare((string *)&this->name);
    return (bool)(extraout_var >> 7);
  }
  return true;
}

Assistant:

bool
File::operator< (File const& rhs) const
{
    if (this->is_dir && !rhs.is_dir)
        return true;
    else if (!this->is_dir && rhs.is_dir)
        return false;
    else if (this->path < rhs.path)
        return true;
    else if (rhs.path < this->path)
        return false;
    else
        return (this->name < rhs.name);
}